

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O2

int __thiscall DeviceTy::disassociatePtr(DeviceTy *this,void *HstPtrBegin)

{
  int iVar1;
  const_iterator __position;
  HostDataToTargetListTy *this_00;
  
  std::mutex::lock(&this->DataMapMtx);
  this_00 = &this->HostDataToTargetMap;
  iVar1 = -1;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) goto LAB_00102cba;
  } while (__position._M_node[1]._M_prev != (_List_node_base *)HstPtrBegin);
  if (0x1fffffffffffffff < (long)__position._M_node[3]._M_next) {
    std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::erase
              (this_00,__position);
    iVar1 = 0;
  }
LAB_00102cba:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return iVar1;
}

Assistant:

int DeviceTy::disassociatePtr(void *HstPtrBegin) {
  DataMapMtx.lock();

  // Check if entry exists
  for (HostDataToTargetListTy::iterator ii = HostDataToTargetMap.begin();
      ii != HostDataToTargetMap.end(); ++ii) {
    if ((uintptr_t)HstPtrBegin == ii->HstPtrBegin) {
      // Mapping exists
      if (CONSIDERED_INF(ii->RefCount)) {
        DP("Association found, removing it\n");
        HostDataToTargetMap.erase(ii);
        DataMapMtx.unlock();
        return OFFLOAD_SUCCESS;
      } else {
        DP("Trying to disassociate a pointer which was not mapped via "
            "omp_target_associate_ptr\n");
        break;
      }
    }
  }

  // Mapping not found
  DataMapMtx.unlock();
  DP("Association not found\n");
  return OFFLOAD_FAIL;
}